

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O0

StringBuilder * __thiscall nv::StringBuilder::number(StringBuilder *this,uint i,int base)

{
  int iVar1;
  char *pcVar2;
  undefined8 in_XMM0_Qa;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar5;
  double dVar3;
  double dVar4;
  uint len;
  int base_local;
  uint i_local;
  StringBuilder *this_local;
  
  uVar5 = (undefined4)((ulong)in_XMM0_Qa >> 0x20);
  if ((base < 2) &&
     (iVar1 = nvAbort("base >= 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                      ,0x179,"StringBuilder &nv::StringBuilder::number(uint, int)"),
     uVar5 = extraout_XMM0_Db, iVar1 == 1)) {
    raise(5);
    uVar5 = extraout_XMM0_Db_00;
  }
  if ((0x24 < base) &&
     (iVar1 = nvAbort("base <= 36",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                      ,0x17a,"StringBuilder &nv::StringBuilder::number(uint, int)"),
     uVar5 = extraout_XMM0_Db_01, iVar1 == 1)) {
    raise(5);
    uVar5 = extraout_XMM0_Db_02;
  }
  dVar3 = std::log((double)CONCAT44(uVar5,(float)i));
  dVar4 = std::log((double)CONCAT44((int)((ulong)dVar3 >> 0x20),(float)base));
  reserve(this,(uint)(long)(SUB84(dVar3,0) / SUB84(dVar4,0) + -0.5 + 1.0));
  pcVar2 = anon_unknown.dwarf_48c640::i2a(i,this->m_str,base);
  *pcVar2 = '\0';
  return this;
}

Assistant:

StringBuilder & StringBuilder::number( uint i, int base )
{
	nvCheck( base >= 2 );
	nvCheck( base <= 36 );

	// @@ This needs to be done correctly.
	// length = floor(log(i, base));
	uint len = uint(log(float(i)) / log(float(base)) - 0.5f + 1);
	reserve(len);

	*i2a(i, m_str, base) = 0;

	return *this;
}